

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void __thiscall node::first_instruction(node *this)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  reference pvVar4;
  string local_38 [36];
  int local_14;
  node *pnStack_10;
  int i;
  node *this_local;
  
  this->no_code = false;
  local_14 = 0;
  pnStack_10 = this;
  while( true ) {
    uVar2 = (ulong)local_14;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->inputCode);
    if (sVar3 <= uVar2) {
      this->pc = '\0';
      this->no_code = true;
      return;
    }
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->inputCode,(long)local_14);
    std::__cxx11::string::string(local_38,(string *)pvVar4);
    bVar1 = is_whitespace((string *)local_38);
    std::__cxx11::string::~string(local_38);
    if (((bVar1 ^ 0xffU) & 1) != 0) break;
    local_14 = local_14 + 1;
  }
  this->pc = (int8_t)local_14;
  return;
}

Assistant:

void node::first_instruction(){
  no_code=false;
  for(int i=0;i<inputCode.size();i++){
    if(!is_whitespace(inputCode[i])){
      pc=i;
      return;
    }
  }
  pc=0;
  no_code=true;
  return;
}